

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O3

int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,Metadata *metadata)

{
  byte bVar1;
  long *plVar2;
  JOCTET *__s1;
  void *__s2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  jpeg_saved_marker_ptr pjVar9;
  jpeg_saved_marker_ptr_conflict pjVar10;
  char *__format;
  uint uVar11;
  ulong uVar12;
  size_t __size;
  long lVar13;
  uint uVar14;
  long lVar15;
  size_t metadata_len;
  ICCPSegment iccp_segments [255];
  ulong auStack_1830 [2];
  Metadata *local_1820;
  ulong local_1818;
  size_t sStack_1810;
  undefined4 auStack_1808 [1526];
  
  uVar6 = 0;
  auStack_1830[0] = 0x104e51;
  memset(&local_1818,0,0x17e8);
  pjVar10 = dinfo->marker_list;
  if (pjVar10 == (jpeg_saved_marker_ptr_conflict)0x0) {
    return 1;
  }
  uVar7 = 0;
  uVar8 = 0;
  __size = 0;
  do {
    if (((pjVar10->marker == 0xe2) && (0xe < (ulong)pjVar10->data_length)) &&
       (plVar2 = (long *)pjVar10->data, (int)plVar2[1] == 0x454c49 && *plVar2 == 0x464f52505f434349)
       ) {
      bVar1 = *(byte *)((long)plVar2 + 0xc);
      uVar4 = (ulong)pjVar10->data_length - 0xe;
      if ((*(byte *)((long)plVar2 + 0xd) == 0) || (bVar1 == 0)) {
        auStack_1830[0] = 0x1050cd;
        fprintf(stderr,"[ICCP] size (%d) / count (%d) / sequence number (%d) cannot be 0!\n",
                uVar4 & 0xffffffff);
        return 0;
      }
      uVar11 = (uint)*(byte *)((long)plVar2 + 0xd);
      uVar14 = uVar11;
      if ((uVar6 != 0) && (uVar14 = uVar6, uVar6 != uVar11)) {
        __format = "[ICCP] Inconsistent segment count (%d / %d)!\n";
        uVar7 = (ulong)uVar6;
        uVar4 = (ulong)uVar11;
        goto LAB_00105098;
      }
      uVar12 = (ulong)(uint)bVar1;
      if (auStack_1830[uVar12 * 3 + 1] != 0) {
        auStack_1830[0] = 0x1050e9;
        fprintf(stderr,"[ICCP] Duplicate segment number (%d)!\n",(ulong)(uint)bVar1);
        return 0;
      }
      auStack_1830[uVar12 * 3] = (long)plVar2 + 0xe;
      auStack_1830[uVar12 * 3 + 1] = uVar4;
      uVar6 = (uint)bVar1;
      *(uint *)(&local_1820 + uVar12 * 3) = uVar6;
      __size = __size + uVar4;
      if (uVar8 <= uVar6) {
        uVar8 = uVar6;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar6 = uVar14;
    }
    pjVar10 = pjVar10->next;
  } while (pjVar10 != (jpeg_saved_marker_ptr)0x0);
  if ((uint)uVar7 != 0) {
    if (uVar8 == (uint)uVar7) {
      if (uVar6 == uVar8) {
        auStack_1830[0] = 0x104f49;
        qsort(&local_1818,(ulong)uVar8,0x18,CompareICCPSegments);
        auStack_1830[0] = 0x104f51;
        puVar5 = (uint8_t *)malloc(__size);
        (metadata->iccp).bytes = puVar5;
        if (puVar5 == (uint8_t *)0x0) {
          return 0;
        }
        (metadata->iccp).size = __size;
        if (uVar8 != 0) {
          lVar15 = 0;
          lVar13 = 0;
          do {
            auStack_1830[0] = 0x104f8a;
            memcpy((metadata->iccp).bytes + lVar13,*(void **)((long)&local_1818 + lVar15),
                   *(size_t *)((long)auStack_1808 + lVar15 + -8));
            lVar13 = lVar13 + *(long *)((long)auStack_1808 + lVar15 + -8);
            lVar15 = lVar15 + 0x18;
          } while ((ulong)uVar8 * 0x18 != lVar15);
        }
        goto LAB_00104f98;
      }
      __format = "[ICCP] Segment count: %d does not match expected: %d!\n";
      uVar7 = (ulong)uVar8;
      uVar4 = (ulong)uVar6;
    }
    else {
      __format = "[ICCP] Discontinuous segments, expected: %d actual: %d!\n";
      uVar4 = (ulong)uVar8;
    }
LAB_00105098:
    auStack_1830[0] = 0x10509f;
    fprintf(stderr,__format,uVar7,uVar4);
    return 0;
  }
LAB_00104f98:
  pjVar9 = dinfo->marker_list;
  local_1820 = metadata;
  if (pjVar9 == (jpeg_saved_marker_ptr_conflict)0x0) {
    return 1;
  }
  do {
    uVar6 = 0xe1;
    lVar13 = 0;
    do {
      if (uVar6 == pjVar9->marker) {
        uVar7 = *(ulong *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].signature_length +
                          lVar13);
        metadata_len = pjVar9->data_length - uVar7;
        if (uVar7 <= pjVar9->data_length && metadata_len != 0) {
          __s1 = pjVar9->data;
          __s2 = *(void **)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].signature + lVar13);
          auStack_1830[0] = 0x104fed;
          iVar3 = bcmp(__s1,__s2,uVar7);
          if (iVar3 == 0) {
            lVar15 = *(long *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[0].storage_offset +
                              lVar13);
            if (*(long *)((long)&(local_1820->exif).bytes + lVar15) == 0) {
              auStack_1830[0] = 0x10501a;
              iVar3 = MetadataCopy((char *)(__s1 + uVar7),metadata_len,
                                   (MetadataPayload *)((long)&(local_1820->exif).bytes + lVar15));
              if (iVar3 == 0) {
                return 0;
              }
            }
            else {
              auStack_1830[0] = 0x105050;
              fprintf(stderr,"Ignoring additional \'%s\' marker\n",__s2);
            }
          }
        }
      }
      uVar6 = *(uint *)((long)&ExtractMetadataFromJPEG::kJPEGMetadataMap[1].marker + lVar13);
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x40);
    pjVar9 = pjVar9->next;
  } while (pjVar9 != (jpeg_saved_marker_ptr)0x0);
  return 1;
}

Assistant:

static int ExtractMetadataFromJPEG(j_decompress_ptr dinfo,
                                   Metadata* const metadata) {
  static const struct {
    int marker;
    const char* signature;
    size_t signature_length;
    size_t storage_offset;
  } kJPEGMetadataMap[] = {
    // Exif 2.2 Section 4.7.2 Interoperability Structure of APP1 ...
    { JPEG_APP1, "Exif\0",                        6, METADATA_OFFSET(exif) },
    // XMP Specification Part 3 Section 3 Embedding XMP Metadata ... #JPEG
    // TODO(jzern) Add support for 'ExtendedXMP'
    { JPEG_APP1, "http://ns.adobe.com/xap/1.0/", 29, METADATA_OFFSET(xmp) },
    { 0, NULL, 0, 0 },
  };
  jpeg_saved_marker_ptr marker;
  // Treat ICC profiles separately as they may be segmented and out of order.
  if (!StoreICCP(dinfo, &metadata->iccp)) return 0;

  for (marker = dinfo->marker_list; marker != NULL; marker = marker->next) {
    int i;
    for (i = 0; kJPEGMetadataMap[i].marker != 0; ++i) {
      if (marker->marker == kJPEGMetadataMap[i].marker &&
          marker->data_length > kJPEGMetadataMap[i].signature_length &&
          !memcmp(marker->data, kJPEGMetadataMap[i].signature,
                  kJPEGMetadataMap[i].signature_length)) {
        MetadataPayload* const payload =
            (MetadataPayload*)((uint8_t*)metadata +
                               kJPEGMetadataMap[i].storage_offset);

        if (payload->bytes == NULL) {
          const char* marker_data = (const char*)marker->data +
                                    kJPEGMetadataMap[i].signature_length;
          const size_t marker_data_length =
              marker->data_length - kJPEGMetadataMap[i].signature_length;
          if (!MetadataCopy(marker_data, marker_data_length, payload)) return 0;
        } else {
          fprintf(stderr, "Ignoring additional '%s' marker\n",
                  kJPEGMetadataMap[i].signature);
        }
      }
    }
  }
  return 1;
}